

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O0

int substrcmp(char *text,char *pat,size_t len)

{
  char cVar1;
  int iVar2;
  char c;
  size_t len_local;
  char *pat_local;
  char *text_local;
  
  cVar1 = *pat;
  pat_local = text;
  if (cVar1 == '\0') {
    text_local._4_4_ = (uint)(*text == '\0');
  }
  else {
    for (; *pat_local != '\0'; pat_local = pat_local + 1) {
      if ((*pat_local == cVar1) && (iVar2 = strncmp(pat_local,pat,len), iVar2 == 0)) {
        return 0;
      }
    }
    text_local._4_4_ = 1;
  }
  return text_local._4_4_;
}

Assistant:

static int substrcmp(const char *text, const char *pat, size_t len)
{
    char c;

    if ((c = *pat) == '\0')
        return *text == '\0';

    for ( ; *text; text++) {
        if (*text == c && strncmp(text, pat, len) == 0)
            return 0;
    }

    return 1;
}